

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.h
# Opt level: O0

bool luna::operator<(String *l,String *r)

{
  int iVar1;
  uint *puVar2;
  long in_RSI;
  long in_RDI;
  int cmp;
  uint len;
  char *r_s;
  char *l_s;
  undefined8 local_40;
  undefined8 local_38;
  undefined1 local_1;
  
  if (*(char *)(in_RDI + 0x11) == '\0') {
    local_38 = (void *)(in_RDI + 0x18);
  }
  else {
    local_38 = *(void **)(in_RDI + 0x18);
  }
  if (*(char *)(in_RSI + 0x11) == '\0') {
    local_40 = (void *)(in_RSI + 0x18);
  }
  else {
    local_40 = *(void **)(in_RSI + 0x18);
  }
  puVar2 = std::min<unsigned_int>((uint *)(in_RDI + 0x28),(uint *)(in_RSI + 0x28));
  iVar1 = memcmp(local_38,local_40,(ulong)*puVar2);
  if (iVar1 == 0) {
    local_1 = *(uint *)(in_RDI + 0x28) < *(uint *)(in_RSI + 0x28);
  }
  else {
    local_1 = iVar1 < 0;
  }
  return local_1;
}

Assistant:

bool operator < (const String &l, const String &r)
        {
            auto *l_s = l.in_heap_ ? l.str_ : l.str_buffer_;
            auto *r_s = r.in_heap_ ? r.str_ : r.str_buffer_;
            auto len = std::min(l.length_, r.length_);
            auto cmp = memcmp(l_s, r_s, len);
            if (cmp == 0)
                return l.length_ < r.length_;
            else
                return cmp < 0;
        }